

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshvolume.cpp
# Opt level: O2

float tetVolume(float *p0,float *p1,float *p2,float *p3)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  
  fVar1 = p0[1];
  fVar2 = p0[2];
  fVar3 = *p0;
  auVar4 = vfmsub231ss_fma(ZEXT416((uint)((p2[2] - fVar2) * (p3[1] - fVar1))),
                           ZEXT416((uint)(p2[1] - fVar1)),ZEXT416((uint)(p3[2] - fVar2)));
  auVar5 = vfmsub231ss_fma(ZEXT416((uint)((p3[2] - fVar2) * (*p2 - fVar3))),
                           ZEXT416((uint)(*p3 - fVar3)),ZEXT416((uint)(p2[2] - fVar2)));
  auVar4 = vfmadd231ss_fma(ZEXT416((uint)((p1[1] - fVar1) * auVar5._0_4_)),
                           ZEXT416((uint)(*p1 - fVar3)),auVar4);
  auVar5 = vfmsub231ss_fma(ZEXT416((uint)((*p3 - fVar3) * (p2[1] - fVar1))),
                           ZEXT416((uint)(*p2 - fVar3)),ZEXT416((uint)(p3[1] - fVar1)));
  auVar4 = vfmadd213ss_fma(auVar5,ZEXT416((uint)(p1[2] - fVar2)),auVar4);
  auVar5._8_4_ = 0x80000000;
  auVar5._0_8_ = 0x8000000080000000;
  auVar5._12_4_ = 0x80000000;
  auVar5 = vxorps_avx512vl(auVar4,auVar5);
  auVar4 = vmaxss_avx(auVar5,auVar4);
  return auVar4._0_4_;
}

Assistant:

inline float tetVolume(const float *p0,const float *p1,const float *p2,const float *p3)
{
	float a[3];
	float b[3];
	float c[3];

  a[0] = p1[0] - p0[0];
  a[1] = p1[1] - p0[1];
  a[2] = p1[2] - p0[2];

	b[0] = p2[0] - p0[0];
	b[1] = p2[1] - p0[1];
	b[2] = p2[2] - p0[2];

  c[0] = p3[0] - p0[0];
  c[1] = p3[1] - p0[1];
  c[2] = p3[2] - p0[2];

  float cross[3];

  CrossProduct( b, c, cross );

	float volume = DotProduct( a, cross );

  if ( volume < 0 )
   return -volume;

  return volume;
}